

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O2

int64_t eval2(C_Parser *parser,C_Node *node,char ***label)

{
  char cVar1;
  int iVar2;
  C_Type *pCVar3;
  _Bool _Var4;
  uint uVar5;
  long lVar6;
  int64_t iVar7;
  ulong uVar8;
  int64_t iVar9;
  ulong uVar10;
  uint uVar11;
  char *fmt;
  C_Token *tok;
  bool bVar12;
  double dVar13;
  
LAB_00122e0a:
  C_add_type(parser,node);
  _Var4 = C_is_flonum(node->ty);
  if (_Var4) {
    dVar13 = eval_double(parser,node);
    return (long)dVar13;
  }
  lVar6 = 0x28;
  switch(node->kind) {
  case ND_ADD:
    iVar7 = eval2(parser,node->lhs,label);
    iVar9 = eval(parser,node->rhs);
    return iVar9 + iVar7;
  case ND_SUB:
    iVar7 = eval2(parser,node->lhs,label);
    iVar9 = eval(parser,node->rhs);
    return iVar7 - iVar9;
  case ND_MUL:
    iVar7 = eval(parser,node->lhs);
    iVar9 = eval(parser,node->rhs);
    return iVar9 * iVar7;
  case ND_DIV:
    _Var4 = node->ty->is_unsigned;
    uVar8 = eval(parser,node->lhs);
    uVar10 = eval(parser,node->rhs);
    if (_Var4 != true) {
      return (long)uVar8 / (long)uVar10;
    }
    return uVar8 / uVar10;
  case ND_NEG:
    iVar7 = eval(parser,node->lhs);
    return -iVar7;
  case ND_MOD:
    _Var4 = node->ty->is_unsigned;
    uVar8 = eval(parser,node->lhs);
    uVar10 = eval(parser,node->rhs);
    if (_Var4 != true) {
      return (long)uVar8 % (long)uVar10;
    }
    return uVar8 % uVar10;
  case ND_BITAND:
    uVar8 = eval(parser,node->lhs);
    uVar10 = eval(parser,node->rhs);
    return uVar10 & uVar8;
  case ND_BITOR:
    uVar8 = eval(parser,node->lhs);
    uVar10 = eval(parser,node->rhs);
    return uVar10 | uVar8;
  case ND_BITXOR:
    uVar8 = eval(parser,node->lhs);
    uVar10 = eval(parser,node->rhs);
    return uVar10 ^ uVar8;
  case ND_SHL:
    iVar7 = eval(parser,node->lhs);
    iVar9 = eval(parser,node->rhs);
    return iVar7 << ((byte)iVar9 & 0x3f);
  case ND_SHR:
    if ((node->ty->is_unsigned == true) && (node->ty->size == 8)) {
      uVar8 = eval(parser,node->lhs);
      iVar7 = eval(parser,node->rhs);
      return uVar8 >> ((byte)iVar7 & 0x3f);
    }
    iVar7 = eval(parser,node->lhs);
    iVar9 = eval(parser,node->rhs);
    return iVar7 >> ((byte)iVar9 & 0x3f);
  case ND_EQ:
    iVar7 = eval(parser,node->lhs);
    iVar9 = eval(parser,node->rhs);
    bVar12 = iVar7 == iVar9;
    goto LAB_001231ac;
  case ND_NE:
    iVar7 = eval(parser,node->lhs);
    iVar9 = eval(parser,node->rhs);
    bVar12 = iVar7 == iVar9;
    goto LAB_00123273;
  case ND_LT:
    _Var4 = node->lhs->ty->is_unsigned;
    uVar8 = eval(parser,node->lhs);
    uVar10 = eval(parser,node->rhs);
    if (_Var4 != true) {
      return (ulong)((long)uVar8 < (long)uVar10);
    }
    return (ulong)(uVar8 < uVar10);
  case ND_LE:
    _Var4 = node->lhs->ty->is_unsigned;
    uVar8 = eval(parser,node->lhs);
    uVar10 = eval(parser,node->rhs);
    if (_Var4 != true) {
      return (ulong)((long)uVar8 <= (long)uVar10);
    }
    return (ulong)(uVar8 <= uVar10);
  case ND_COND:
    iVar7 = eval(parser,node->cond);
    lVar6 = (ulong)(iVar7 == 0) * 8 + 0x38;
  case ND_COMMA:
    goto switchD_00122e3b_caseD_12;
  case ND_MEMBER:
    if (label != (char ***)0x0) {
      if (node->ty->kind == TY_ARRAY) {
        iVar7 = eval_rval(parser,node->lhs,label);
        return node->member->offset + iVar7;
      }
LAB_00123303:
      tok = node->tok;
      fmt = "invalid initializer";
      goto LAB_001232f9;
    }
    break;
  case ND_ADDR:
    iVar7 = eval_rval(parser,node->lhs,label);
    return iVar7;
  case ND_NOT:
    iVar7 = eval(parser,node->lhs);
    bVar12 = iVar7 == 0;
LAB_001231ac:
    return (ulong)bVar12;
  case ND_BITNOT:
    uVar8 = eval(parser,node->lhs);
    return ~uVar8;
  case ND_LOGAND:
    iVar7 = eval(parser,node->lhs);
    if (iVar7 == 0) {
      return 0;
    }
    goto LAB_00123261;
  case ND_LOGOR:
    iVar7 = eval(parser,node->lhs);
    if (iVar7 != 0) {
      return 1;
    }
LAB_00123261:
    iVar7 = eval(parser,node->rhs);
    bVar12 = iVar7 == 0;
LAB_00123273:
    return (ulong)!bVar12;
  case ND_LABEL_VAL:
    *label = &node->unique_label;
    return 0;
  case ND_VAR:
    if (label != (char ***)0x0) {
      if (node->var->ty->kind - TY_FUNC < 2) {
        *label = &node->var->name;
        return 0;
      }
      goto LAB_00123303;
    }
    break;
  case ND_NUM:
    return node->val;
  case ND_CAST:
    uVar8 = eval2(parser,node->lhs,label);
    _Var4 = C_is_integer(node->ty);
    if (!_Var4) {
      return uVar8;
    }
    pCVar3 = node->ty;
    iVar2 = pCVar3->size;
    if (iVar2 == 4) {
      return uVar8 & 0xffffffff;
    }
    if (iVar2 == 2) {
      uVar11 = (uint)uVar8 & 0xffff;
      cVar1 = pCVar3->is_unsigned;
      uVar5 = (uint)(short)uVar8;
    }
    else {
      if (iVar2 != 1) {
        return uVar8;
      }
      uVar11 = (uint)uVar8 & 0xff;
      cVar1 = pCVar3->is_unsigned;
      uVar5 = (uint)(char)uVar8;
    }
    if (cVar1 != '\0') {
      uVar5 = uVar11;
    }
    return (long)(int)uVar5;
  }
  tok = node->tok;
  fmt = "not a compile-time constant";
LAB_001232f9:
  C_error_tok(parser,tok,fmt);
switchD_00122e3b_caseD_12:
  node = *(C_Node **)((long)&node->kind + lVar6);
  goto LAB_00122e0a;
}

Assistant:

static int64_t eval2(C_Parser *parser, C_Node *node, char ***label) {
  C_add_type(parser, node);

  if (C_is_flonum(node->ty))
    return eval_double(parser, node);

  switch (node->kind) {
  case ND_ADD:
    return eval2(parser, node->lhs, label) + eval(parser, node->rhs);
  case ND_SUB:
    return eval2(parser, node->lhs, label) - eval(parser, node->rhs);
  case ND_MUL:
    return eval(parser, node->lhs) * eval(parser, node->rhs);
  case ND_DIV:
    if (node->ty->is_unsigned)
      return (uint64_t)eval(parser, node->lhs) / eval(parser, node->rhs);
    return eval(parser, node->lhs) / eval(parser, node->rhs);
  case ND_NEG:
    return -eval(parser, node->lhs);
  case ND_MOD:
    if (node->ty->is_unsigned)
      return (uint64_t)eval(parser, node->lhs) % eval(parser, node->rhs);
    return eval(parser, node->lhs) % eval(parser, node->rhs);
  case ND_BITAND:
    return eval(parser, node->lhs) & eval(parser, node->rhs);
  case ND_BITOR:
    return eval(parser, node->lhs) | eval(parser, node->rhs);
  case ND_BITXOR:
    return eval(parser, node->lhs) ^ eval(parser, node->rhs);
  case ND_SHL:
    return eval(parser, node->lhs) << eval(parser, node->rhs);
  case ND_SHR:
    if (node->ty->is_unsigned && node->ty->size == 8)
      return (uint64_t)eval(parser, node->lhs) >> eval(parser, node->rhs);
    return eval(parser, node->lhs) >> eval(parser, node->rhs);
  case ND_EQ:
    return eval(parser, node->lhs) == eval(parser, node->rhs);
  case ND_NE:
    return eval(parser, node->lhs) != eval(parser, node->rhs);
  case ND_LT:
    if (node->lhs->ty->is_unsigned)
      return (uint64_t)eval(parser, node->lhs) < eval(parser, node->rhs);
    return eval(parser, node->lhs) < eval(parser, node->rhs);
  case ND_LE:
    if (node->lhs->ty->is_unsigned)
      return (uint64_t)eval(parser, node->lhs) <= eval(parser, node->rhs);
    return eval(parser, node->lhs) <= eval(parser, node->rhs);
  case ND_COND:
    return eval(parser, node->cond) ? eval2(parser, node->then, label) : eval2(parser, node->els, label);
  case ND_COMMA:
    return eval2(parser, node->rhs, label);
  case ND_NOT:
    return !eval(parser, node->lhs);
  case ND_BITNOT:
    return ~eval(parser, node->lhs);
  case ND_LOGAND:
    return eval(parser, node->lhs) && eval(parser, node->rhs);
  case ND_LOGOR:
    return eval(parser, node->lhs) || eval(parser, node->rhs);
  case ND_CAST: {
    int64_t val = eval2(parser, node->lhs, label);
    if (C_is_integer(node->ty)) {
      switch (node->ty->size) {
      case 1: return node->ty->is_unsigned ? (uint8_t)val : (int8_t)val;
      case 2: return node->ty->is_unsigned ? (uint16_t)val : (int16_t)val;
      case 4: return node->ty->is_unsigned ? (uint32_t)val : (int32_t)val;
      }
    }
    return val;
  }
  case ND_ADDR:
    return eval_rval(parser, node->lhs, label);
  case ND_LABEL_VAL:
    *label = &node->unique_label;
    return 0;
  case ND_MEMBER:
    if (!label)
      C_error_tok(parser, node->tok, "not a compile-time constant");
    if (node->ty->kind != TY_ARRAY)
      C_error_tok(parser, node->tok, "invalid initializer");
    return eval_rval(parser, node->lhs, label) + node->member->offset;
  case ND_VAR:
    if (!label)
      C_error_tok(parser, node->tok, "not a compile-time constant");
    if (node->var->ty->kind != TY_ARRAY && node->var->ty->kind != TY_FUNC)
      C_error_tok(parser, node->tok, "invalid initializer");
    *label = &node->var->name;
    return 0;
  case ND_NUM:
    return node->val;
  default:
    break;
  }

  C_error_tok(parser, node->tok, "not a compile-time constant");
  return 0; // not reached
}